

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImRect IVar6;
  
  switch(rect_type) {
  case 0:
    IVar6 = ImGuiWindow::Rect(window);
    break;
  case 1:
    IVar6 = window->OuterRectClipped;
    break;
  case 2:
    IVar6 = window->InnerRect;
    break;
  case 3:
    IVar6 = window->InnerClipRect;
    break;
  case 4:
    IVar6 = window->WorkRect;
    break;
  case 5:
    IVar1 = window->ContentSize;
    goto LAB_00155f66;
  case 6:
    IVar1 = window->ContentSizeIdeal;
LAB_00155f66:
    auVar4._8_8_ = 0;
    auVar4._0_4_ = (window->Scroll).x;
    auVar4._4_4_ = (window->Scroll).y;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = (window->InnerRect).Min.x;
    auVar5._4_4_ = (window->InnerRect).Min.y;
    auVar4 = vsubps_avx(auVar5,auVar4);
    fVar2 = auVar4._0_4_ + (window->WindowPadding).x;
    fVar3 = auVar4._4_4_ + (window->WindowPadding).y;
    IVar6.Min.y = fVar3;
    IVar6.Min.x = fVar2;
    IVar6.Max.y = fVar3 + IVar1.y;
    IVar6.Max.x = fVar2 + IVar1.x;
    break;
  case 7:
    IVar6 = window->ContentRegionRect;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2a32,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  return IVar6;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }